

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall ktx::ValidationContext::error<>(ValidationContext *this,IssueError *issue)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  underlying_type_t<ktx::ReturnCode> uVar1;
  ValidationReport *this_00;
  ValidationReport *extraout_RDX;
  undefined1 *in_RSI;
  char *in_RDI;
  undefined1 in_stack_000000f8 [16];
  undefined1 in_stack_00000108 [16];
  ValidationReport *__args;
  basic_string_view<char> *in_stack_fffffffffffffe90;
  undefined1 *puVar2;
  allocator<char> *__a;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  allocator<char> local_111;
  undefined1 local_110;
  undefined2 local_10e;
  undefined1 auStack_e8 [32];
  undefined1 *local_c8;
  ValidationReport *local_b8 [2];
  undefined8 local_a8;
  ValidationReport **local_a0;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *local_70;
  ValidationReport **local_58;
  undefined8 *local_50;
  ValidationReport **local_48;
  undefined8 local_40;
  undefined8 *local_38;
  ValidationReport **local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 1;
  local_c8 = in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)(in_RDI + 0x2c) = uVar1;
  local_110 = *local_c8;
  local_10e = *(undefined2 *)(local_c8 + 2);
  __a = &local_111;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,__a);
  puVar2 = auStack_e8;
  local_18 = (undefined8 *)(local_c8 + 0x18);
  local_10 = &stack0xfffffffffffffec8;
  local_28 = *local_18;
  local_20 = *(undefined8 *)(local_c8 + 0x20);
  s._M_str = in_RDI;
  s._M_len = (size_t)puVar2;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            (in_stack_fffffffffffffe90,s);
  local_8 = local_18;
  local_70 = local_88;
  local_78 = puVar2;
  this_00 = (ValidationReport *)
            ::fmt::v10::make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_50 = &local_a8;
  local_58 = local_b8;
  local_40 = 0;
  local_a8 = 0;
  __args = extraout_RDX;
  local_b8[0] = this_00;
  local_48 = local_58;
  local_38 = local_50;
  local_30 = local_58;
  local_a0 = local_58;
  ::fmt::v10::vformat_abi_cxx11_((string_view)in_stack_00000108,(format_args)in_stack_000000f8);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            ((function<void_(const_ktx::ValidationReport_&)> *)this_00,__args);
  ValidationReport::~ValidationReport(this_00);
  std::allocator<char>::~allocator(&local_111);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }